

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1,char_const(&)[9]>(char (*args_) [9])

{
  bool bVar1;
  size_type sVar2;
  handle *this;
  undefined8 uVar3;
  iterator pvVar4;
  iterator pvVar5;
  PyObject **ppPVar6;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_1UL> *__range2;
  int counter;
  size_t i;
  array<pybind11::object,_1UL> args;
  size_t size;
  tuple *result;
  object *in_stack_ffffffffffffff18;
  cast_error *in_stack_ffffffffffffff20;
  PyTypeObject *pPVar7;
  handle in_stack_ffffffffffffff28;
  array<pybind11::object,_1UL> *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  tuple *in_stack_ffffffffffffff40;
  handle local_80;
  undefined8 in_stack_ffffffffffffff88;
  return_value_policy policy;
  char *in_stack_ffffffffffffff90;
  handle in_stack_ffffffffffffff98;
  int local_58;
  ulong local_50;
  handle local_38;
  PyObject *local_30;
  array<pybind11::object,_1UL> *local_28;
  array<pybind11::object,_1UL> local_20;
  undefined8 local_18;
  
  policy = (return_value_policy)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_18 = 1;
  local_28 = &local_20;
  handle::handle(&local_38,(PyObject *)0x0);
  local_30 = (PyObject *)
             detail::type_caster<char,_void>::cast
                       (in_stack_ffffffffffffff90,policy,in_stack_ffffffffffffff98);
  reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff28);
  local_50 = 0;
  while( true ) {
    sVar2 = std::array<pybind11::object,_1UL>::size(&local_20);
    if (sVar2 <= local_50) {
      tuple::tuple(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_58 = 0;
      pvVar4 = std::array<pybind11::object,_1UL>::begin((array<pybind11::object,_1UL> *)0x295857);
      pvVar5 = std::array<pybind11::object,_1UL>::end((array<pybind11::object,_1UL> *)0x29586c);
      for (; pvVar4 != pvVar5; pvVar4 = pvVar4 + 1) {
        local_80 = object::release(in_stack_ffffffffffffff18);
        ppPVar6 = handle::ptr(&local_80);
        pPVar7 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar6)[1].ob_type)[local_58] = pPVar7;
        local_58 = local_58 + 1;
      }
      std::array<pybind11::object,_1UL>::~array(in_stack_ffffffffffffff30);
      return (tuple)in_RDI.super_handle.m_ptr;
    }
    this = &std::array<pybind11::object,_1UL>::operator[]
                      ((array<pybind11::object,_1UL> *)in_stack_ffffffffffffff20,
                       (size_type)in_stack_ffffffffffffff18)->super_handle;
    bVar1 = handle::operator_cast_to_bool(this);
    if (!bVar1) break;
    local_50 = local_50 + 1;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  cast_error::runtime_error(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  __cxa_throw(uVar3,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}